

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QString,_QDBusConnectionPrivate::WatchedServiceData>::
emplace_helper<QDBusConnectionPrivate::WatchedServiceData>
          (QHash<QString,_QDBusConnectionPrivate::WatchedServiceData> *this,QString *key,
          WatchedServiceData *args)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  piter pVar4;
  Node<QString,_QDBusConnectionPrivate::WatchedServiceData> *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QString,_QDBusConnectionPrivate::WatchedServiceData>_>::
  findOrInsert<QString>((InsertionResult *)local_38,this->d,key);
  this_00 = (Node<QString,_QDBusConnectionPrivate::WatchedServiceData> *)
            ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
            (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
            [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    pDVar1 = (key->d).d;
    (key->d).d = (Data *)0x0;
    (this_00->key).d.d = pDVar1;
    pcVar2 = (key->d).ptr;
    (key->d).ptr = (char16_t *)0x0;
    (this_00->key).d.ptr = pcVar2;
    qVar3 = (key->d).size;
    (key->d).size = 0;
    (this_00->key).d.size = qVar3;
    pDVar1 = (args->owner).d.d;
    (args->owner).d.d = (Data *)0x0;
    (this_00->value).owner.d.d = pDVar1;
    pcVar2 = (args->owner).d.ptr;
    (args->owner).d.ptr = (char16_t *)0x0;
    (this_00->value).owner.d.ptr = pcVar2;
    qVar3 = (args->owner).d.size;
    (args->owner).d.size = 0;
    (this_00->value).owner.d.size = qVar3;
    (this_00->value).refcount = args->refcount;
  }
  else {
    QHashPrivate::Node<QString,_QDBusConnectionPrivate::WatchedServiceData>::
    emplaceValue<QDBusConnectionPrivate::WatchedServiceData>(this_00,args);
  }
  pVar4.bucket = local_38._8_8_;
  pVar4.d = (Data<QHashPrivate::Node<QString,_QDBusConnectionPrivate::WatchedServiceData>_> *)
            local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar4;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }